

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

int mbedtls_mpi_core_get_mont_r2_unsafe(mbedtls_mpi *X,mbedtls_mpi *N)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_lset(X,1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_shift_l(X,(ulong)N->n << 7);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_mod_mpi(X,X,N);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_shrink(X,(ulong)N->n);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_core_get_mont_r2_unsafe(mbedtls_mpi *X,
                                        const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(X, N->n * 2 * biL));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(X, X, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(X, N->n));

cleanup:
    return ret;
}